

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O2

void __thiscall
ClCommandLine_MissingValue_Test::~ClCommandLine_MissingValue_Test
          (ClCommandLine_MissingValue_Test *this)

{
  anon_unknown.dwarf_1ee32::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, MissingValue) {
    opt<std::string> opt{"opt", required};

    this->add ("progname", "--opt");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_FALSE (res);

    EXPECT_THAT (errors.str (), testing::HasSubstr (PSTORE_NATIVE_TEXT ("requires a value")));
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (opt.get (), "");
}